

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

void __thiscall ExecutionEngine::i_fconst_2(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  Value operand;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  operand.data.longValue = 0x40000000;
  operand.printType = BOOLEAN;
  operand.type = FLOAT;
  Frame::pushIntoOperandStack(this_01,operand);
  this_01->pc = this_01->pc + 1;
  return;
}

Assistant:

void ExecutionEngine::i_fconst_2() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();

    Value value;
    value.type = ValueType::FLOAT;
    value.data.floatValue = 2;

    topFrame->pushIntoOperandStack(value);

    topFrame->pc += 1;
}